

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O0

void __thiscall xray_re::xr_ini_file::ini_section::merge(ini_section *this,ini_section *section)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  reference ppiVar4;
  char *s1;
  char *s2;
  ini_item *piVar5;
  string *psVar6;
  reference ppiVar7;
  ini_item *local_90;
  const_iterator local_88;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_80 [2];
  ini_item **local_70;
  ini_item **local_68;
  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_60;
  ini_item_vec_it it1;
  ini_item *item;
  ini_item_vec_cit last_1;
  ini_item_vec_cit it_1;
  ini_item *local_30;
  __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
  local_28;
  ini_item_vec_cit last;
  ini_item_vec_cit it;
  ini_section *section_local;
  ini_section *this_local;
  
  bVar1 = std::
          vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
          ::empty(&this->items);
  if (bVar1) {
    __n = size(section);
    std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
    ::reserve(&this->items,__n);
    last = begin(section);
    local_28._M_current = (ini_item **)end(section);
    while (bVar1 = __gnu_cxx::operator!=(&last,&local_28), bVar1) {
      piVar5 = (ini_item *)operator_new(0x40);
      ppiVar4 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                ::operator*(&last);
      ini_item::ini_item(piVar5,*ppiVar4);
      local_30 = piVar5;
      std::
      vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>::
      push_back(&this->items,&local_30);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
      ::operator++(&last);
    }
  }
  else {
    last_1 = begin(section);
    item = (ini_item *)end(section);
    while (bVar1 = __gnu_cxx::operator!=
                             (&last_1,(__normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                                       *)&item), bVar1) {
      ppiVar4 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                ::operator*(&last_1);
      it1._M_current = (ini_item **)*ppiVar4;
      local_68 = (ini_item **)begin(this);
      local_70 = (ini_item **)end(this);
      local_60 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<xray_re::xr_ini_file::ini_item**,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>,xray_re::xr_ini_file::ini_item_const*,xray_re::ptr_less<xray_re::xr_ini_file::ini_item>>
                           (local_68,local_70,&it1);
      local_80[0]._M_current = (ini_item **)end(this);
      bVar2 = __gnu_cxx::operator==(&local_60,local_80);
      bVar1 = true;
      if (!bVar2) {
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
        ::operator*(&local_60);
        s1 = (char *)std::__cxx11::string::c_str();
        s2 = (char *)std::__cxx11::string::c_str();
        iVar3 = xr_stricmp(s1,s2);
        bVar1 = iVar3 != 0;
      }
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
        ::__normal_iterator<xray_re::xr_ini_file::ini_item**>
                  ((__normal_iterator<xray_re::xr_ini_file::ini_item*const*,std::vector<xray_re::xr_ini_file::ini_item*,std::allocator<xray_re::xr_ini_file::ini_item*>>>
                    *)&local_88,&local_60);
        piVar5 = (ini_item *)operator_new(0x40);
        ini_item::ini_item(piVar5,(ini_item *)it1._M_current);
        local_90 = piVar5;
        std::
        vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
        ::insert(&this->items,local_88,&local_90);
      }
      else {
        psVar6 = (string *)(it1._M_current + 4);
        ppiVar7 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_ini_file::ini_item_**,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
                  ::operator*(&local_60);
        std::__cxx11::string::operator=((string *)&(*ppiVar7)->value,psVar6);
      }
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ini_file::ini_item_*const_*,_std::vector<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>_>
      ::operator++(&last_1);
    }
  }
  return;
}

Assistant:

void xr_ini_file::ini_section::merge(const ini_section* section)
{
	if (items.empty()) {
		items.reserve(section->size());
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			items.push_back(new ini_item(**it));
		}
	} else {
		// FIXME: do it O(max(M, N)) instead of O(M*log(N))
		for (ini_item_vec_cit it = section->begin(), last = section->end();
				it != last; ++it) {
			const ini_item* item = *it;
			ini_item_vec_it it1 = std::lower_bound(begin(), end(), item, ptr_less<ini_item>());
			if (it1 == end() || xr_stricmp((*it1)->name.c_str(), item->name.c_str()) != 0)
				items.insert(it1, new ini_item(*item));
			else
				(*it1)->value = item->value;
		}
	}
}